

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Expression*,std::allocator<wasm::
Expression*>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm
::Function*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&)>)::Mapper::
Mapper(wasm::Module&,std::map<wasm::Function*,std::vector<wasm::Expression*,std::allocator<wasm::
Expression*>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,std::
vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&,std::function<void(wasm::
Function*,std::vector<wasm::Expression*,std::allocator<wasm::Expression_>_>__>_
          (void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_030a0a10;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::
  function<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&)>
  ::function((function<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&)>
              *)((long)this + 0x140),
             (function<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&)>
              *)work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}